

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sDrawTests.cpp
# Opt level: O3

int __thiscall deqp::gles31::Stress::DrawTests::init(DrawTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "unaligned_data","Test with unaligned data");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"drawarrays",
             "draw arrays");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"drawelements"
             ,"draw elements");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  node_01 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,pCVar1->m_testCtx,"random","random draw commands.");
  node_01[1]._vptr_TestNode = (_func_int **)pCVar1;
  node_01->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b3c408;
  tcu::TestNode::addChild(pTVar2,node_01);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"data_over_bounds_with_count",
             "Draw arrays vertex elements beyond the array end are accessed");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__InvalidDrawCase_00b3c458;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  tcu::TestNode::addChild(node,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"data_over_bounds_with_first",
             "Draw arrays vertex elements beyond the array end are accessed");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__InvalidDrawCase_00b3c458;
  pTVar2[1].m_testCtx = (TestContext *)0x100000000;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 0;
  tcu::TestNode::addChild(node,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"data_over_bounds_with_primcount",
             "Draw arrays vertex elements beyond the array end are accessed");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__InvalidDrawCase_00b3c458;
  pTVar2[1].m_testCtx = (TestContext *)0x200000000;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 0;
  tcu::TestNode::addChild(node,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"reserved_non_zero",
             "reservedMustBeZero is set to non-zero value");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__InvalidDrawCase_00b3c458;
  pTVar2[1].m_testCtx = (TestContext *)0x500000000;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 0;
  tcu::TestNode::addChild(node,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"data_over_bounds_with_count",
             "Draw elements vertex elements beyond the array end are accessed");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__InvalidDrawCase_00b3c458;
  *(undefined4 *)&pTVar2[1].m_testCtx = 1;
  *(undefined8 *)((long)&pTVar2[1].m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  tcu::TestNode::addChild(node_00,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"data_over_bounds_with_basevertex",
             "Draw elements vertex elements beyond the array end are accessed");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__InvalidDrawCase_00b3c458;
  pTVar2[1].m_testCtx = (TestContext *)0x100000001;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 0;
  tcu::TestNode::addChild(node_00,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"data_over_bounds_with_indices",
             "Draw elements vertex elements beyond the array end are accessed");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__InvalidDrawCase_00b3c458;
  pTVar2[1].m_testCtx = (TestContext *)0x600000001;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 0;
  tcu::TestNode::addChild(node_00,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"data_over_bounds_with_primcount",
             "Draw elements vertex elements beyond the array end are accessed");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__InvalidDrawCase_00b3c458;
  pTVar2[1].m_testCtx = (TestContext *)0x200000001;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 0;
  tcu::TestNode::addChild(node_00,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"index_over_bounds_with_count",
             "Draw elements index elements beyond the array end are accessed");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__InvalidDrawCase_00b3c458;
  pTVar2[1].m_testCtx = (TestContext *)0x300000001;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 0;
  tcu::TestNode::addChild(node_00,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"index_over_bounds_with_firstindex",
             "Draw elements index elements beyond the array end are accessed");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__InvalidDrawCase_00b3c458;
  pTVar2[1].m_testCtx = (TestContext *)0x400000001;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 0;
  tcu::TestNode::addChild(node_00,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"reserved_non_zero",
             "reservedMustBeZero is set to non-zero value");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__InvalidDrawCase_00b3c458;
  pTVar2[1].m_testCtx = (TestContext *)0x500000001;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 0;
  tcu::TestNode::addChild(node_00,pTVar2);
  return extraout_EAX;
}

Assistant:

void DrawTests::init (void)
{
	tcu::TestCaseGroup* const unalignedGroup	= new tcu::TestCaseGroup(m_testCtx, "unaligned_data", "Test with unaligned data");
	tcu::TestCaseGroup* const drawArraysGroup	= new tcu::TestCaseGroup(m_testCtx, "drawarrays", "draw arrays");
	tcu::TestCaseGroup* const drawElementsGroup	= new tcu::TestCaseGroup(m_testCtx, "drawelements", "draw elements");

	addChild(unalignedGroup);
	addChild(drawArraysGroup);
	addChild(drawElementsGroup);

	// .unaligned_data
	{
		unalignedGroup->addChild(new RandomGroup(m_context, "random", "random draw commands."));
	}

	// .drawarrays
	{
		drawArraysGroup->addChild(new InvalidDrawCase(m_context, "data_over_bounds_with_count",			"Draw arrays vertex elements beyond the array end are accessed",	InvalidDrawCase::DRAW_ARRAYS,	InvalidDrawCase::INVALID_DATA_COUNT));
		drawArraysGroup->addChild(new InvalidDrawCase(m_context, "data_over_bounds_with_first",			"Draw arrays vertex elements beyond the array end are accessed",	InvalidDrawCase::DRAW_ARRAYS,	InvalidDrawCase::INVALID_DATA_FIRST));
		drawArraysGroup->addChild(new InvalidDrawCase(m_context, "data_over_bounds_with_primcount",		"Draw arrays vertex elements beyond the array end are accessed",	InvalidDrawCase::DRAW_ARRAYS,	InvalidDrawCase::INVALID_DATA_INSTANCED));
		drawArraysGroup->addChild(new InvalidDrawCase(m_context, "reserved_non_zero",					"reservedMustBeZero is set to non-zero value",						InvalidDrawCase::DRAW_ARRAYS,	InvalidDrawCase::INVALID_RESERVED));
	}

	// .drawelements
	{
		drawElementsGroup->addChild(new InvalidDrawCase(m_context, "data_over_bounds_with_count",		"Draw elements vertex elements beyond the array end are accessed",	InvalidDrawCase::DRAW_ELEMENTS, InvalidDrawCase::INVALID_DATA_COUNT));
		drawElementsGroup->addChild(new InvalidDrawCase(m_context, "data_over_bounds_with_basevertex",	"Draw elements vertex elements beyond the array end are accessed",	InvalidDrawCase::DRAW_ELEMENTS,	InvalidDrawCase::INVALID_DATA_FIRST));
		drawElementsGroup->addChild(new InvalidDrawCase(m_context, "data_over_bounds_with_indices",		"Draw elements vertex elements beyond the array end are accessed",	InvalidDrawCase::DRAW_ELEMENTS,	InvalidDrawCase::INVALID_INDEX));
		drawElementsGroup->addChild(new InvalidDrawCase(m_context, "data_over_bounds_with_primcount",	"Draw elements vertex elements beyond the array end are accessed",	InvalidDrawCase::DRAW_ELEMENTS,	InvalidDrawCase::INVALID_DATA_INSTANCED));
		drawElementsGroup->addChild(new InvalidDrawCase(m_context, "index_over_bounds_with_count",		"Draw elements index elements beyond the array end are accessed",	InvalidDrawCase::DRAW_ELEMENTS,	InvalidDrawCase::INVALID_INDEX_COUNT));
		drawElementsGroup->addChild(new InvalidDrawCase(m_context, "index_over_bounds_with_firstindex",	"Draw elements index elements beyond the array end are accessed",	InvalidDrawCase::DRAW_ELEMENTS,	InvalidDrawCase::INVALID_INDEX_FIRST));
		drawElementsGroup->addChild(new InvalidDrawCase(m_context, "reserved_non_zero",					"reservedMustBeZero is set to non-zero value",						InvalidDrawCase::DRAW_ELEMENTS,	InvalidDrawCase::INVALID_RESERVED));
	}
}